

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

void duckdb::MergeUpdateInfo<unsigned_long>(UpdateInfo *current,unsigned_long *result_data)

{
  sel_t *psVar1;
  unsigned_long *__src;
  void *in_RSI;
  long in_RDI;
  idx_t i;
  unsigned_long *info_data;
  sel_t *tuples;
  ulong local_28;
  
  psVar1 = UpdateInfo::GetTuples((UpdateInfo *)0xbbd4e8);
  __src = UpdateInfo::GetData<unsigned_long>((UpdateInfo *)0xbbd4f7);
  if (*(int *)(in_RDI + 0x20) == 0x800) {
    memcpy(in_RSI,__src,(ulong)*(uint *)(in_RDI + 0x20) << 3);
  }
  else {
    for (local_28 = 0; local_28 < *(uint *)(in_RDI + 0x20); local_28 = local_28 + 1) {
      *(unsigned_long *)((long)in_RSI + (ulong)psVar1[local_28] * 8) = __src[local_28];
    }
  }
  return;
}

Assistant:

static void MergeUpdateInfo(UpdateInfo &current, T *result_data) {
	auto tuples = current.GetTuples();
	auto info_data = current.GetData<T>();
	if (current.N == STANDARD_VECTOR_SIZE) {
		// special case: update touches ALL tuples of this vector
		// in this case we can just memcpy the data
		// since the layout of the update info is guaranteed to be [0, 1, 2, 3, ...]
		memcpy(result_data, info_data, sizeof(T) * current.N);
	} else {
		for (idx_t i = 0; i < current.N; i++) {
			result_data[tuples[i]] = info_data[i];
		}
	}
}